

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

void __thiscall
rangeless::fn::impl::
maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
::reset(maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
        *this,seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
              *val)

{
  seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
  *val_local;
  maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
  *this_local;
  
  reset(this);
  seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
  ::seq((seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>
         *)this,val);
  this->m_empty = false;
  return;
}

Assistant:

void reset(T&& val)
        {
            // NB: even if we are holding a value, we don't move-assign to it
            // and instead reset and place-new, because the type may be
            // move-constructible but not move-assigneable, e.g. containing a closure.
            // https://stackoverflow.com/questi ons/38541354/move-assignable-lambdas-in-clang-and-gcc/
            //
            // Another reason we can't simply move-assign to
            // is that T may be a tuple containing 
            // references, and we want to assign maybe<T> of such tuple
            // without assigning referenced objects as a side-effect,
            // unlike std::optional: (See NB[2])
            //     int x = 42;
            //     int y = 99;
            //     std::optional<std::tuple<int&>> opt_x = std::tie(x);
            //     std::optional<std::tuple<int&>> opt_y = std::tie(y);
            //     opt_x = opt_y; // x is now 99. For our purposes this is NOT what we want.
            //
            // For our purposes maybe<T> MUST behave similarly to a unique_ptr, 
            // except with stack-storage, where move-assignment simply transfers ownership.
            //
            // We are not sacrificing any correctness or performance because no copies are ever made anywhere - 
            // all assignments and argument-passing are by-move; T does not even need to be copy-constructible/assignable.
            //
            // We absolutely cannot rely on T::operator=(...), 
            // but the user code, however, can always invoke it directly as appropriate, e.g.
            //      *nonempty_maybe_vec = other_vec; // uses vector's operator= (will reuse existing internal storage without reallocation when possible).
            //
            // Note: We used to take T by value `reset(T val)`, since we're passing and taking by move, while also 
            // allowing the user-code to pass by implicit copy if they need to, but changed it to taking by rvalue-reference
            // `reset(T&& val)` only, to disallow the user-code to accidentally write inefficient code like
            // nonemmpty_maybe_vec.reset(other_vec), which destroys the currently-held vector, and makes a copy of
            // other vec while passing it by value. Instead, the user-code would be forced to write
            //      *nonempty_maybe_vec = other_vec.
            //
            // (this was never a use-case in this library, but disallowing it anyway based on feedback).
            //
            // Related:
            // http://www.open-std.org/jtc1/sc22/wg21/docs/papers/2013/n3527.html#optional_ref.rationale.assign
            // https://www.fluentcpp.com/2018/10/05/pros-cons-optional-references/

            reset();
            
            new (&m_value) T(std::move(val));

            m_empty = false;
        }